

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

void __thiscall QDomNodePrivate::~QDomNodePrivate(QDomNodePrivate *this)

{
  QAtomicInt *pQVar1;
  QDomNodePrivate *pQVar2;
  Data *pDVar3;
  QDomNodePrivate *this_00;
  
  this->_vptr_QDomNodePrivate = (_func_int **)&PTR__QDomNodePrivate_00127fa0;
  this_00 = this->first;
  while (this_00 != (QDomNodePrivate *)0x0) {
    pQVar2 = this_00->next;
    LOCK();
    pQVar1 = &this_00->ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*this_00->_vptr_QDomNodePrivate[1])();
      this_00 = pQVar2;
    }
    else {
      setNoParent(this_00);
      this_00 = pQVar2;
    }
  }
  this->first = (QDomNodePrivate *)0x0;
  this->last = (QDomNodePrivate *)0x0;
  pDVar3 = (this->namespaceURI).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->namespaceURI).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar3 = (this->prefix).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->prefix).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar3 = (this->value).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->value).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar3 = (this->name).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->name).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QDomNodePrivate::~QDomNodePrivate()
{
    QDomNodePrivate* p = first;
    QDomNodePrivate* n;

    while (p) {
        n = p->next;
        if (!p->ref.deref())
            delete p;
        else
            p->setNoParent();
        p = n;
    }
    first = nullptr;
    last = nullptr;
}